

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O0

KinematicsModel * __thiscall
COLLADASaxFWL::DocumentProcessor::getKinematicsModelByUri(DocumentProcessor *this,URI *uri)

{
  bool bVar1;
  _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_00;
  pointer ppVar2;
  long in_RDI;
  const_iterator it;
  KinematicsModelMap *map;
  _Hashtable_iterator_base<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false>
  local_40;
  _Hash_node<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false> *local_30;
  _Hash_node<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false> *__k;
  KinematicsModel *local_8;
  
  __k = local_30;
  this_00 = (_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             *)KinematicsIntermediateData::getKinematicsModels
                         (*(KinematicsIntermediateData **)(in_RDI + 0x60));
  _local_30 = (_Hashtable_iterator_base<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false>
               )std::tr1::
                _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ::find(this_00,(key_type *)__k);
  local_40 = (_Hashtable_iterator_base<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false>
              )std::tr1::
               _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               ::end((_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                      *)0x78a6b4);
  bVar1 = std::tr1::__detail::operator!=
                    ((_Hashtable_iterator_base<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false>
                      *)&local_30,&local_40);
  if (bVar1) {
    ppVar2 = std::tr1::__detail::
             _Hashtable_const_iterator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false,_false>
             ::operator->((_Hashtable_const_iterator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false,_false>
                           *)&local_30);
    local_8 = ppVar2->second;
  }
  else {
    local_8 = (KinematicsModel *)0x0;
  }
  return local_8;
}

Assistant:

KinematicsModel* DocumentProcessor::getKinematicsModelByUri( const COLLADABU::URI& uri )
	{
		const KinematicsIntermediateData::KinematicsModelMap& map = mKinematicsIntermediateData.getKinematicsModels();
		KinematicsIntermediateData::KinematicsModelMap::const_iterator it = map.find(uri);
		if ( it != map.end() )
		{
			return it->second;
		}
		else
		{
			return 0;
		}
	}